

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

Qualifiers __thiscall anon_unknown.dwarf_25095d::Db::parseCVQualifiers(Db *this)

{
  char *pcVar1;
  Qualifiers QVar2;
  char *pcVar3;
  
  pcVar3 = this->First;
  pcVar1 = this->Last;
  QVar2 = QualNone;
  if ((pcVar3 != pcVar1) && (*pcVar3 == 'r')) {
    pcVar3 = pcVar3 + 1;
    this->First = pcVar3;
    QVar2 = QualRestrict;
  }
  if ((pcVar3 != pcVar1) && (*pcVar3 == 'V')) {
    pcVar3 = pcVar3 + 1;
    this->First = pcVar3;
    QVar2 = QVar2 | QualVolatile;
  }
  if ((pcVar3 != pcVar1) && (*pcVar3 == 'K')) {
    this->First = pcVar3 + 1;
    QVar2 = QVar2 | QualConst;
  }
  return QVar2;
}

Assistant:

bool consumeIf(char C) {
    if (First != Last && *First == C) {
      ++First;
      return true;
    }
    return false;
  }